

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_func.cpp
# Opt level: O0

void __thiscall FParser::SF_SpawnExplosion(FParser *this)

{
  PClassActor *pPVar1;
  bool bVar2;
  int iVar3;
  sector_t *psVar4;
  FState *newstate;
  FSoundID local_88;
  FName local_84;
  TVector2<double> local_80;
  TVector2<double> local_70 [2];
  svalue_t local_50;
  PClassActor *local_38;
  PClassActor *pclass;
  AActor *spawn;
  DVector3 pos;
  FParser *this_local;
  
  pos.Z = (double)this;
  TVector3<double>::TVector3((TVector3<double> *)&spawn);
  bVar2 = CheckArgs(this,3);
  if (bVar2) {
    svalue_t::svalue_t(&local_50,this->t_argv);
    local_38 = T_GetMobjType(&local_50);
    bVar2 = local_38 != (PClassActor *)0x0;
    svalue_t::~svalue_t(&local_50);
    if (bVar2) {
      spawn = (AActor *)floatvalue(this->t_argv + 1);
      pos.X = floatvalue(this->t_argv + 2);
      if (this->t_argc < 4) {
        TVector2<double>::TVector2(local_70,(TVector3<double> *)&spawn);
        psVar4 = P_PointInSector(local_70);
        TVector2<double>::TVector2(&local_80,(TVector3<double> *)&spawn);
        pos.Y = secplane_t::ZatPoint(&psVar4->floorplane,&local_80);
      }
      else {
        pos.Y = floatvalue(this->t_argv + 3);
      }
      pclass = (PClassActor *)Spawn(local_38,(DVector3 *)&spawn,ALLOW_REPLACE);
      (this->t_return).type = 1;
      (this->t_return).value.i = 0;
      if ((AActor *)pclass != (AActor *)0x0) {
        AActor::ClearCounters((AActor *)pclass);
        pPVar1 = pclass;
        FName::FName(&local_84,NAME_Death);
        newstate = AActor::FindState((AActor *)pPVar1,&local_84);
        bVar2 = AActor::SetState((AActor *)pPVar1,newstate,false);
        *(uint *)&(this->t_return).value = (uint)bVar2;
        iVar3 = FSoundID::operator_cast_to_int(&pclass[1].MeleeSound);
        pPVar1 = pclass;
        if (iVar3 != 0) {
          FSoundID::FSoundID(&local_88,&pclass[1].MeleeSound);
          S_Sound((AActor *)pPVar1,4,&local_88,1.0,1.0);
        }
      }
    }
  }
  return;
}

Assistant:

void FParser::SF_SpawnExplosion()
{
	DVector3 pos;
	AActor*   spawn;
	PClassActor * pclass;
	
	if (CheckArgs(3))
	{
		if (!(pclass=T_GetMobjType(t_argv[0]))) return;
		
		pos.X = floatvalue(t_argv[1]);
		pos.Y = floatvalue(t_argv[2]);
		if(t_argc > 3)
			pos.Z = floatvalue(t_argv[3]);
		else
			pos.Z = P_PointInSector(pos)->floorplane.ZatPoint(pos);
		
		spawn = Spawn (pclass, pos, ALLOW_REPLACE);
		t_return.type = svt_int;
		t_return.value.i=0;
		if (spawn)
		{
			spawn->ClearCounters();
			t_return.value.i = spawn->SetState(spawn->FindState(NAME_Death));
			if(spawn->DeathSound) S_Sound (spawn, CHAN_BODY, spawn->DeathSound, 1, ATTN_NORM);
		}
	}
}